

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_data.c
# Opt level: O0

LY_ERR lyd_print_path(char *path,lyd_node *root,LYD_FORMAT format,uint32_t options)

{
  ly_out *plStack_38;
  LY_ERR ret__;
  ly_out *out;
  uint32_t local_28;
  LY_ERR ret;
  uint32_t options_local;
  LYD_FORMAT format_local;
  lyd_node *root_local;
  char *path_local;
  
  local_28 = options;
  ret = format;
  _options_local = root;
  root_local = (lyd_node *)path;
  if (path == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","path","lyd_print_path");
    path_local._4_4_ = LY_EINVAL;
  }
  else {
    path_local._4_4_ = ly_out_new_filepath(path,&stack0xffffffffffffffc8);
    if (path_local._4_4_ == LY_SUCCESS) {
      out._4_4_ = lyd_print_(plStack_38,_options_local,ret,local_28);
      ly_out_free(plStack_38,(_func_void_void_ptr *)0x0,'\0');
      path_local._4_4_ = out._4_4_;
    }
  }
  return path_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_print_path(const char *path, const struct lyd_node *root, LYD_FORMAT format, uint32_t options)
{
    LY_ERR ret;
    struct ly_out *out;

    LY_CHECK_ARG_RET(NULL, path, LY_EINVAL);

    LY_CHECK_RET(ly_out_new_filepath(path, &out));
    ret = lyd_print_(out, root, format, options);
    ly_out_free(out, NULL, 0);
    return ret;
}